

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O0

void __thiscall MPLSParser::parseExtensionData(MPLSParser *this,uint8_t *data,uint8_t *dataEnd)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint dataLength_00;
  ostream *this_00;
  uint32_t dataLength;
  uint32_t dataAddress;
  uint32_t dataID;
  int i;
  uchar entries;
  undefined1 local_40 [8];
  BitStreamReader reader;
  uint8_t *dataEnd_local;
  uint8_t *data_local;
  MPLSParser *this_local;
  
  reader._24_8_ = dataEnd;
  BitStreamReader::BitStreamReader((BitStreamReader *)local_40);
  BitStreamReader::setBuffer((BitStreamReader *)local_40,data,(uint8_t *)reader._24_8_);
  uVar2 = BitStreamReader::getBits((BitStreamReader *)local_40,0x20);
  if (uVar2 != 0) {
    BitStreamReader::skipBits((BitStreamReader *)local_40,0x20);
    BitStreamReader::skipBits((BitStreamReader *)local_40,0x18);
    bVar1 = BitStreamReader::getBits<unsigned_char>((BitStreamReader *)local_40,8);
    for (dataAddress = 0; (int)dataAddress < (int)(uint)bVar1; dataAddress = dataAddress + 1) {
      uVar2 = BitStreamReader::getBits((BitStreamReader *)local_40,0x20);
      uVar3 = BitStreamReader::getBits((BitStreamReader *)local_40,0x20);
      dataLength_00 = BitStreamReader::getBits((BitStreamReader *)local_40,0x20);
      if (reader.m_curVal - (int)data < uVar3 + dataLength_00) {
        this_00 = std::operator<<((ostream *)&std::cerr,"Invalid playlist extension entry skipped.")
        ;
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
        sLastMsg = true;
      }
      else if (uVar3 + dataLength_00 <= reader.m_curVal - (int)data) {
        if (uVar2 == 0x20001) {
          this->isDependStreamExist = true;
          parseStnTableSS(this,data + uVar3,dataLength_00);
        }
        else if (uVar2 == 0x20002) {
          this->isDependStreamExist = true;
          parseSubPathEntryExtension(this,data + uVar3,dataLength_00);
        }
      }
    }
  }
  return;
}

Assistant:

void MPLSParser::parseExtensionData(uint8_t* data, const uint8_t* dataEnd)
{
    try
    {
        BitStreamReader reader{};
        reader.setBuffer(data, dataEnd);
        if (reader.getBits(32) == 0)  // length
            return;

        reader.skipBits(32);  // data_block_start_address
        reader.skipBits(24);
        const auto entries = reader.getBits<uint8_t>(8);
        for (int i = 0; i < entries; ++i)
        {
            const uint32_t dataID = reader.getBits(32);
            const uint32_t dataAddress = reader.getBits(32);
            const uint32_t dataLength = reader.getBits(32);

            if (dataAddress + dataLength > static_cast<uint32_t>(dataEnd - data))
            {
                LTRACE(LT_WARN, 2, "Invalid playlist extension entry skipped.");
                continue;
            }

            if (dataAddress + dataLength > static_cast<uint32_t>(dataEnd - data))
                continue;  // invalid entry

            switch (dataID)
            {
            case 0x00020001:
                // stn table ss
                isDependStreamExist = true;
                parseStnTableSS(data + dataAddress, dataLength);
                break;
            case 0x00020002:
                // stn table ss
                isDependStreamExist = true;
                parseSubPathEntryExtension(data + dataAddress, dataLength);
                break;
            default:;
            }
        }
    }
    catch (...)
    {
    }
}